

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O0

void __thiscall Darts::Details::DoubleArrayBuilder::fix_all_blocks(DoubleArrayBuilder *this)

{
  id_type iVar1;
  size_t sVar2;
  id_type block_id;
  id_type end;
  id_type begin;
  id_type block_id_00;
  id_type iVar3;
  
  block_id_00 = 0;
  sVar2 = num_blocks((DoubleArrayBuilder *)0x47c8e0);
  if (0x10 < sVar2) {
    sVar2 = num_blocks((DoubleArrayBuilder *)0x47c8f0);
    block_id_00 = (int)sVar2 - 0x10;
  }
  sVar2 = num_blocks((DoubleArrayBuilder *)0x47c902);
  iVar1 = (id_type)sVar2;
  iVar3 = block_id_00;
  for (; block_id_00 != iVar1; block_id_00 = block_id_00 + 1) {
    fix_block((DoubleArrayBuilder *)CONCAT44(iVar3,iVar1),block_id_00);
  }
  return;
}

Assistant:

inline void DoubleArrayBuilder::fix_all_blocks() {
  id_type begin = 0;
  if (num_blocks() > NUM_EXTRA_BLOCKS) {
    begin = num_blocks() - NUM_EXTRA_BLOCKS;
  }
  id_type end = num_blocks();

  for (id_type block_id = begin; block_id != end; ++block_id) {
    fix_block(block_id);
  }
}